

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_2)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  int nlp;
  int np;
  ParametersBase *local_30;
  int local_28;
  int local_24;
  
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_24);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_28);
  lVar3 = *(long *)(this + 0x20);
  lVar2 = *(long *)(this + 0x18);
  if (local_24 != (int)((ulong)(lVar3 - lVar2) >> 3)) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.h"
                  ,0x8b,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  if (local_28 == (int)((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30)) >> 3)) {
    for (uVar4 = 0; (ulong)uVar4 < (ulong)(lVar3 - lVar2 >> 3); uVar4 = uVar4 + 1) {
      boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
      invoke<cnn::Parameters>(ar,*(Parameters **)(lVar2 + (ulong)uVar4 * 8));
      lVar2 = *(long *)(this + 0x18);
      lVar3 = *(long *)(this + 0x20);
    }
    uVar4 = 0;
    while( true ) {
      if ((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30) >> 3) <= (ulong)uVar4) break;
      boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
      invoke<cnn::LookupParameters>
                (ar,*(LookupParameters **)(*(long *)(this + 0x30) + (ulong)uVar4 * 8));
      uVar4 = uVar4 + 1;
    }
    if (*(long *)(this + 8) != *(long *)this) {
      *(long *)(this + 8) = *(long *)this;
    }
    puVar1 = *(undefined8 **)(this + 0x20);
    for (puVar5 = *(undefined8 **)(this + 0x18); puVar5 != puVar1; puVar5 = puVar5 + 1) {
      local_30 = (ParametersBase *)*puVar5;
      std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
      emplace_back<cnn::ParametersBase*>
                ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,&local_30
                );
    }
    puVar1 = *(undefined8 **)(this + 0x38);
    for (puVar5 = *(undefined8 **)(this + 0x30); puVar5 != puVar1; puVar5 = puVar5 + 1) {
      local_30 = (ParametersBase *)*puVar5;
      std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
      emplace_back<cnn::ParametersBase*>
                ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,&local_30
                );
    }
    return;
  }
  __assert_fail("nlp == (int)lookup_params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.h"
                ,0x8c,
                "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }